

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerBailForDebugger(Lowerer *this,Instr *instr,bool isInsideHelper)

{
  code *pcVar1;
  bool bVar2;
  RegNum reg;
  BailOutKind BVar3;
  int iVar4;
  BailOutKind BVar5;
  int32 iVar6;
  undefined4 *puVar7;
  ScriptContextInfo *pSVar8;
  undefined4 extraout_var;
  LabelInstr *target;
  LabelInstr *target_00;
  LabelInstr *target_01;
  BranchInstr *insertBeforeInstr;
  size_t sVar10;
  MemRefOpnd *pMVar11;
  IntConstOpnd *pIVar12;
  JITTimeFunctionBody *pJVar13;
  intptr_t iVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  RegOpnd *pRVar15;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  StackSym *sym_00;
  SymOpnd *compareSrc1;
  undefined4 extraout_var_04;
  MemRefOpnd *src;
  RegOpnd *reg1;
  Opnd *opnd2_7;
  Opnd *opnd1_7;
  Opnd *opnd2_6;
  Opnd *opnd1_6;
  StackSym *sym;
  int32 hasLocalVarChangedOffset;
  Opnd *opnd2_5;
  Opnd *opnd1_5;
  RegNum effectiveFrameBaseReg;
  Opnd *opnd2_4;
  Opnd *opnd1_4;
  Opnd *opnd2_3;
  Opnd *opnd1_3;
  Opnd *opnd2_2;
  Opnd *opnd1_2;
  Opnd *opnd2_1;
  Opnd *opnd1_1;
  Opnd *opnd2;
  Opnd *opnd1;
  BailOutKind c_forceAndIgnoreEx;
  bool doGenerateBailOutDocumentBlock;
  BranchInstr *continueBranchInstr;
  LabelInstr *continueLabel;
  LabelInstr *bailOutLabel;
  LabelInstr *bailOutDocumentLabel;
  intptr_t flags;
  LabelInstr *explicitBailOutLabel;
  Instr *pIStack_28;
  BailOutKind bailOutKind;
  Instr *prevInstr;
  Instr *pIStack_18;
  bool isInsideHelper_local;
  Instr *instr_local;
  Lowerer *this_local;
  long lVar9;
  
  pIStack_28 = instr->m_prev;
  prevInstr._7_1_ = isInsideHelper;
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  explicitBailOutLabel._4_4_ = IR::Instr::GetBailOutKind(instr);
  bVar2 = IR::operator!(explicitBailOutLabel._4_4_);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3237,"(bailOutKind)","bailOutKind should not be zero at this time.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  BVar3 = IR::operator&(explicitBailOutLabel._4_4_,BailOutExplicit);
  bVar2 = IR::operator!(BVar3);
  if ((!bVar2) && (explicitBailOutLabel._4_4_ != BailOutExplicit)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3239,
                       "(!(bailOutKind & IR::BailOutExplicit) || bailOutKind == IR::BailOutExplicit)"
                       ,"BailOutExplicit cannot be combined with any other bailout flags.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  flags = 0;
  BVar3 = IR::operator&(explicitBailOutLabel._4_4_,BailOutExplicit);
  bVar2 = IR::operator!(BVar3);
  if (bVar2) {
    pSVar8 = Func::GetScriptContextInfo(this->m_func);
    iVar4 = (*pSVar8->_vptr_ScriptContextInfo[0x26])();
    lVar9 = CONCAT44(extraout_var,iVar4);
    target = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(pIStack_18,&target->super_Instr);
    target_00 = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(pIStack_18,&target_00->super_Instr);
    target_01 = IR::LabelInstr::New(Label,this->m_func,(bool)(prevInstr._7_1_ & 1));
    IR::Instr::InsertAfter(pIStack_18,&target_01->super_Instr);
    insertBeforeInstr = InsertBranch(Br,target_01,&target->super_Instr);
    BVar3 = IR::operator|(BailOutForceByFlag,BailOutIgnoreException);
    BVar5 = IR::operator&(explicitBailOutLabel._4_4_,BVar3);
    if (BVar5 == BVar3) {
      sVar10 = DebuggingFlags::GetForceInterpreterOffset();
      pMVar11 = IR::MemRefOpnd::New((void *)(lVar9 + sVar10),TyInt16,this->m_func,
                                    AddrOpndKindDynamicMisc);
      pIVar12 = IR::IntConstOpnd::New(0,TyInt16,this->m_func,true);
      InsertCompareBranch(this,&pMVar11->super_Opnd,&pIVar12->super_Opnd,BrNeq_A,target_00,
                          &insertBeforeInstr->super_Instr,false);
      IR::operator^=((BailOutKind *)((long)&explicitBailOutLabel + 4),BVar3);
    }
    else {
      BVar3 = IR::operator&(explicitBailOutLabel._4_4_,BailOutForceByFlag);
      if (BVar3 != BailOutInvalid) {
        sVar10 = DebuggingFlags::GetForceInterpreterOffset();
        pMVar11 = IR::MemRefOpnd::New((void *)(lVar9 + sVar10),TyInt8,this->m_func,
                                      AddrOpndKindDynamicMisc);
        pIVar12 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,true);
        InsertCompareBranch(this,&pMVar11->super_Opnd,&pIVar12->super_Opnd,BrNeq_A,target_00,
                            &insertBeforeInstr->super_Instr,false);
        IR::operator^=((BailOutKind *)((long)&explicitBailOutLabel + 4),BailOutForceByFlag);
      }
      BVar3 = IR::operator&(explicitBailOutLabel._4_4_,BailOutIgnoreException);
      if (BVar3 != BailOutInvalid) {
        sVar10 = DebuggingFlags::GetByteCodeOffsetAfterIgnoreExceptionOffset();
        pMVar11 = IR::MemRefOpnd::New((void *)(lVar9 + sVar10),TyInt32,this->m_func,
                                      AddrOpndKindDynamicMisc);
        pIVar12 = IR::IntConstOpnd::New(-1,TyInt32,this->m_func,true);
        InsertCompareBranch(this,&pMVar11->super_Opnd,&pIVar12->super_Opnd,BrNeq_A,target_00,
                            &insertBeforeInstr->super_Instr,false);
        IR::operator^=((BailOutKind *)((long)&explicitBailOutLabel + 4),BailOutIgnoreException);
      }
    }
    BVar3 = IR::operator&(explicitBailOutLabel._4_4_,BailOutBreakPointInFunction);
    if (BVar3 != BailOutInvalid) {
      pJVar13 = Func::GetJITFunctionBody(this->m_func);
      iVar14 = JITTimeFunctionBody::GetProbeCountAddr(pJVar13);
      pMVar11 = IR::MemRefOpnd::New(iVar14,TyInt32,this->m_func,AddrOpndKindDynamicMisc);
      pIVar12 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
      InsertCompareBranch(this,&pMVar11->super_Opnd,&pIVar12->super_Opnd,BrNeq_A,target_00,
                          &insertBeforeInstr->super_Instr,false);
      IR::operator^=((BailOutKind *)((long)&explicitBailOutLabel + 4),BailOutBreakPointInFunction);
    }
    BVar3 = IR::operator&(explicitBailOutLabel._4_4_,BailOutStep);
    if (BVar3 != BailOutInvalid) {
      pSVar8 = Func::GetScriptContextInfo(this->m_func);
      iVar4 = (*pSVar8->_vptr_ScriptContextInfo[0x27])();
      pMVar11 = IR::MemRefOpnd::New(CONCAT44(extraout_var_00,iVar4),TyInt8,this->m_func,
                                    AddrOpndKindDynamicMisc);
      pIVar12 = IR::IntConstOpnd::New(3,TyInt8,this->m_func,true);
      InsertTestBranch(&pMVar11->super_Opnd,&pIVar12->super_Opnd,BrNeq_A,target_00,
                       &insertBeforeInstr->super_Instr);
      pSVar8 = Func::GetScriptContextInfo(this->m_func);
      iVar4 = (*pSVar8->_vptr_ScriptContextInfo[0x27])();
      pMVar11 = IR::MemRefOpnd::New(CONCAT44(extraout_var_01,iVar4),TyInt8,this->m_func,
                                    AddrOpndKindDynamicMisc);
      pIVar12 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
      InsertCompareBranch(this,&pMVar11->super_Opnd,&pIVar12->super_Opnd,BrEq_A,true,target,
                          &insertBeforeInstr->super_Instr,false);
      IR::operator^=((BailOutKind *)((long)&explicitBailOutLabel + 4),BailOutStep);
    }
    BVar5 = IR::operator&(explicitBailOutLabel._4_4_,BailOutStackFrameBase);
    if (BVar5 != BailOutInvalid) {
      reg = LowererMD::GetRegStackPointer();
      pRVar15 = IR::RegOpnd::New((StackSym *)0x0,reg,TyInt64,this->m_func);
      pSVar8 = Func::GetScriptContextInfo(this->m_func);
      iVar4 = (*pSVar8->_vptr_ScriptContextInfo[0x28])();
      pMVar11 = IR::MemRefOpnd::New(CONCAT44(extraout_var_02,iVar4),TyInt64,this->m_func,
                                    AddrOpndKindDynamicMisc);
      InsertCompareBranch(this,&pRVar15->super_Opnd,&pMVar11->super_Opnd,BrGt_A,true,target_00,
                          &insertBeforeInstr->super_Instr,false);
      pSVar8 = Func::GetScriptContextInfo(this->m_func);
      iVar4 = (*pSVar8->_vptr_ScriptContextInfo[0x27])();
      pMVar11 = IR::MemRefOpnd::New(CONCAT44(extraout_var_03,iVar4),TyInt8,this->m_func,
                                    AddrOpndKindDynamicMisc);
      pIVar12 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,true);
      InsertCompareBranch(this,&pMVar11->super_Opnd,&pIVar12->super_Opnd,BrEq_A,true,target,
                          &insertBeforeInstr->super_Instr,false);
      IR::operator^=((BailOutKind *)((long)&explicitBailOutLabel + 4),BailOutStackFrameBase);
    }
    opnd1._7_1_ = BVar5 != BailOutInvalid || BVar3 != BailOutInvalid;
    BVar3 = IR::operator&(explicitBailOutLabel._4_4_,BailOutLocalValueChanged);
    if (BVar3 != BailOutInvalid) {
      iVar6 = Func::GetHasLocalVarChangedOffset(this->m_func);
      if (iVar6 != -1) {
        sym_00 = StackSym::New(TyInt8,this->m_func);
        sym_00->m_offset = iVar6;
        *(uint *)&sym_00->field_0x18 = *(uint *)&sym_00->field_0x18 & 0xffffefff | 0x1000;
        compareSrc1 = IR::SymOpnd::New(&sym_00->super_Sym,TyInt8,this->m_func);
        pIVar12 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
        InsertCompareBranch(this,&compareSrc1->super_Opnd,&pIVar12->super_Opnd,BrNeq_A,target_00,
                            &insertBeforeInstr->super_Instr,false);
      }
      IR::operator^=((BailOutKind *)((long)&explicitBailOutLabel + 4),BailOutLocalValueChanged);
    }
    if (opnd1._7_1_) {
      pJVar13 = Func::GetJITFunctionBody(this->m_func);
      iVar14 = JITTimeFunctionBody::GetScriptIdAddr(pJVar13);
      pMVar11 = IR::MemRefOpnd::New(iVar14,TyInt32,this->m_func,AddrOpndKindDynamicMisc);
      pSVar8 = Func::GetScriptContextInfo(this->m_func);
      iVar4 = (*pSVar8->_vptr_ScriptContextInfo[0x29])();
      src = IR::MemRefOpnd::New(CONCAT44(extraout_var_04,iVar4),TyInt32,this->m_func,
                                AddrOpndKindDynamicMisc);
      pRVar15 = IR::RegOpnd::New(TyInt32,this->m_func);
      InsertMove(&pRVar15->super_Opnd,&src->super_Opnd,&target_00->super_Instr,true);
      InsertCompareBranch(this,&pMVar11->super_Opnd,&pRVar15->super_Opnd,BrEq_A,true,target_01,
                          &target_00->super_Instr,false);
    }
    if (explicitBailOutLabel._4_4_ != BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x32d3,"(bailOutKind == (IR::BailOutKind)0)",
                         "Some of the bits in BailOutKind were not processed!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  else {
    flags = (intptr_t)IR::LabelInstr::New(Label,this->m_func,false);
  }
  GenerateBailOut(this,pIStack_18,(BranchInstr *)0x0,(LabelInstr *)flags,(LabelInstr *)0x0);
  return pIStack_28;
}

Assistant:

IR::Instr *
Lowerer::LowerBailForDebugger(IR::Instr* instr, bool isInsideHelper /* = false */)
{
    IR::Instr * prevInstr = instr->m_prev;

    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
    AssertMsg(bailOutKind, "bailOutKind should not be zero at this time.");
    AssertMsg(!(bailOutKind & IR::BailOutExplicit) || bailOutKind == IR::BailOutExplicit,
        "BailOutExplicit cannot be combined with any other bailout flags.");

    IR::LabelInstr* explicitBailOutLabel = nullptr;

    if (!(bailOutKind & IR::BailOutExplicit))
    {
        intptr_t flags = m_func->GetScriptContextInfo()->GetDebuggingFlagsAddr();

        // Check 1 (do we need to bail out?)
        // JXX bailoutLabel
        // Check 2 (do we need to bail out?)
        // JXX bailoutLabel
        // ...
        // JMP continueLabel
        // bailoutDocumentLabel:
        // (determine if document boundary reached - if not, JMP to continueLabel)
        //  NOTE: THIS BLOCK IS CONDITIONALLY GENERATED BASED ON doGenerateBailOutDocumentBlock
        // bailoutLabel:
        // bail out
        // continueLabel:
        // ...

        IR::LabelInstr* bailOutDocumentLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, /*isOpHelper*/ true);
        instr->InsertBefore(bailOutDocumentLabel);
        IR::LabelInstr* bailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, /*isOpHelper*/ true);
        instr->InsertBefore(bailOutLabel);
        IR::LabelInstr* continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, /*isOpHelper*/ isInsideHelper);
        instr->InsertAfter(continueLabel);
        IR::BranchInstr* continueBranchInstr = this->InsertBranch(Js::OpCode::Br, continueLabel, bailOutDocumentLabel);    // JMP continueLabel.

        bool doGenerateBailOutDocumentBlock = false;

        const IR::BailOutKind c_forceAndIgnoreEx = IR::BailOutForceByFlag | IR::BailOutIgnoreException;
        if ((bailOutKind & c_forceAndIgnoreEx) == c_forceAndIgnoreEx)
        {
            // It's faster to check these together in 1 check rather than 2 separate checks at run time.
            // CMP [&(flags->m_forceInterpreter, flags->m_isIgnoreException)], 0
            // BNE bailout
            IR::Opnd* opnd1 = IR::MemRefOpnd::New((BYTE*)flags + DebuggingFlags::GetForceInterpreterOffset(), TyInt16, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt16, m_func, /*dontEncode*/ true);
            InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
            bailOutKind ^= c_forceAndIgnoreEx;
        }
        else
        {
            if (bailOutKind & IR::BailOutForceByFlag)
            {
                // CMP [&flags->m_forceInterpreter], 0
                // BNE bailout
                IR::Opnd* opnd1 = IR::MemRefOpnd::New((BYTE*)flags + DebuggingFlags::GetForceInterpreterOffset(), TyInt8, m_func);
                IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt8, m_func, /*dontEncode*/ true);
                InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
                bailOutKind ^= IR::BailOutForceByFlag;
            }
            if (bailOutKind & IR::BailOutIgnoreException)
            {
                // CMP [&flags->m_byteCodeOffsetAfterIgnoreException], DebuggingFlags::InvalidByteCodeOffset
                // BNE bailout
                IR::Opnd* opnd1 = IR::MemRefOpnd::New((BYTE*)flags + DebuggingFlags::GetByteCodeOffsetAfterIgnoreExceptionOffset(), TyInt32, m_func);
                IR::Opnd* opnd2 = IR::IntConstOpnd::New(DebuggingFlags::InvalidByteCodeOffset, TyInt32, m_func, /*dontEncode*/ true);
                InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
                bailOutKind ^= IR::BailOutIgnoreException;
            }
        }

        if (bailOutKind & IR::BailOutBreakPointInFunction)
        {
            // CMP [&functionBody->m_sourceInfo.m_probeCount], 0
            // BNE bailout
            IR::Opnd* opnd1 = IR::MemRefOpnd::New(m_func->GetJITFunctionBody()->GetProbeCountAddr(), TyInt32, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt32, m_func, /*dontEncode*/ true);
            InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
            bailOutKind ^= IR::BailOutBreakPointInFunction;
        }

        // on method entry
        if(bailOutKind & IR::BailOutStep)
        {
            // TEST STEP_BAILOUT, [&stepController->StepType]
            // BNE BailoutLabel
            IR::Opnd* opnd1 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugStepTypeAddr(), TyInt8, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(Js::STEP_BAILOUT, TyInt8, this->m_func, /*dontEncode*/ true);
            InsertTestBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);

            // CMP  STEP_DOCUMENT, [&stepController->StepType]
            // BEQ BailoutDocumentLabel
            opnd1 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugStepTypeAddr(), TyInt8, m_func);
            opnd2 = IR::IntConstOpnd::New(Js::STEP_DOCUMENT, TyInt8, this->m_func, /*dontEncode*/ true);
            InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrEq_A, /*isUnsigned*/ true, bailOutDocumentLabel, continueBranchInstr);

            doGenerateBailOutDocumentBlock = true;

            bailOutKind ^= IR::BailOutStep;
        }

        // on method exit
        if (bailOutKind & IR::BailOutStackFrameBase)
        {
            // CMP EffectiveFrameBase, [&stepController->frameAddrWhenSet]
            // BA bailoutLabel
            RegNum effectiveFrameBaseReg;
#ifdef _M_X64
            effectiveFrameBaseReg = m_lowererMD.GetRegStackPointer();
#else
            effectiveFrameBaseReg = m_lowererMD.GetRegFramePointer();
#endif
            IR::Opnd* opnd1 = IR::RegOpnd::New(nullptr, effectiveFrameBaseReg, TyMachReg, m_func);
            IR::Opnd* opnd2 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugFrameAddressAddr(), TyMachReg, m_func);
            this->InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrGt_A, /*isUnsigned*/ true, bailOutLabel, continueBranchInstr);

            // CMP  STEP_DOCUMENT, [&stepController->StepType]
            // BEQ BailoutDocumentLabel
            opnd1 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugStepTypeAddr(), TyInt8, m_func);
            opnd2 = IR::IntConstOpnd::New(Js::STEP_DOCUMENT, TyInt8, this->m_func, /*dontEncode*/ true);
            InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrEq_A, /*isUnsigned*/ true, bailOutDocumentLabel, continueBranchInstr);

            doGenerateBailOutDocumentBlock = true;

            bailOutKind ^= IR::BailOutStackFrameBase;
        }

        if (bailOutKind & IR::BailOutLocalValueChanged)
        {
            int32 hasLocalVarChangedOffset = m_func->GetHasLocalVarChangedOffset();
            if (hasLocalVarChangedOffset != Js::Constants::InvalidOffset)
            {
                // CMP [EBP + hasLocalVarChangedStackOffset], 0
                // BNE bailout
                StackSym* sym = StackSym::New(TyInt8, m_func);
                sym->m_offset = hasLocalVarChangedOffset;
                sym->m_allocated = true;
                IR::Opnd* opnd1 = IR::SymOpnd::New(sym, TyInt8, m_func);
                IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt8, m_func);
                InsertCompareBranch(opnd1, opnd2, Js::OpCode::BrNeq_A, bailOutLabel, continueBranchInstr);
            }
            bailOutKind ^= IR::BailOutLocalValueChanged;
        }

        if (doGenerateBailOutDocumentBlock)
        {
            // GENERATE the BailoutDocumentLabel
            // bailOutDocumentLabel:
            //   CMP CurrentScriptId, [&stepController->ScriptIdWhenSet]
            //   BEQ ContinueLabel
            // bailOutLabel:                // (fallthrough bailOutLabel)
            IR::Opnd* opnd1 = IR::MemRefOpnd::New(m_func->GetJITFunctionBody()->GetScriptIdAddr(), TyInt32, m_func);

            IR::Opnd* opnd2 = IR::MemRefOpnd::New(m_func->GetScriptContextInfo()->GetDebugScriptIdWhenSetAddr(), TyInt32, m_func);
            IR::RegOpnd* reg1 = IR::RegOpnd::New(TyInt32, m_func);
            InsertMove(reg1, opnd2, bailOutLabel);

            InsertCompareBranch(opnd1, reg1, Js::OpCode::BrEq_A, /*isUnsigned*/ true, continueLabel, bailOutLabel);
        }

        AssertMsg(bailOutKind == (IR::BailOutKind)0, "Some of the bits in BailOutKind were not processed!");

        // Note: at this time the 'instr' is in between bailoutLabel and continueLabel.
    }
    else
    {
        // For explicit/unconditional bailout use label which is not a helper, otherwise we would get a helper in main code path
        // which breaks helper label consistency (you can only get to helper from a conditional branch in main code), see DbCheckPostLower.
        explicitBailOutLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, false);
    }

    this->GenerateBailOut(instr, nullptr, explicitBailOutLabel);

    return prevInstr;
}